

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O3

void __thiscall ConditionalMeaning::Dump(ConditionalMeaning *this,ostream *out)

{
  Activation *pAVar1;
  
  if (this->condition->kind != MEANING) {
    __assert_fail("condition->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0xc4,"virtual void ConditionalMeaning::Dump(std::ostream &)");
  }
  if (this->true_branch->kind == MEANING) {
    if (this->false_branch->kind == MEANING) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(meaning-if ",0xc);
      pAVar1 = (this->condition->field_1).activation;
      (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      pAVar1 = (this->true_branch->field_1).activation;
      (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      pAVar1 = (this->false_branch->field_1).activation;
      (*(code *)(pAVar1->parent->field_1).symbol_value)(pAVar1,out);
      std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
      return;
    }
    __assert_fail("false_branch->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0xc6,"virtual void ConditionalMeaning::Dump(std::ostream &)");
  }
  __assert_fail("true_branch->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0xc5,"virtual void ConditionalMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    assert(condition->IsMeaning());
    assert(true_branch->IsMeaning());
    assert(false_branch->IsMeaning());
    out << "(meaning-if ";
    condition->meaning->Dump(out);
    out << " ";
    true_branch->meaning->Dump(out);
    out << " ";
    false_branch->meaning->Dump(out);
    out << ")";
  }